

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

action Search::choose_oracle_action
                 (search_private *priv,size_t ec_cnt,action *oracle_actions,
                 size_t oracle_actions_cnt,action *allowed_actions,size_t allowed_actions_cnt,
                 float *allowed_actions_cost)

{
  ulong uVar1;
  uint target;
  wclass *pwVar2;
  bool bVar3;
  uint uVar4;
  size_t k;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  v_array<Search::action_cache> *this;
  polylabel *ppVar8;
  size_t sVar9;
  size_t k_1;
  uint32_t *puVar10;
  float fVar11;
  float fVar12;
  action_cache local_50;
  size_t local_40;
  v_array<Search::action_cache> *this_cache;
  
  if (priv->use_action_costs == true) {
    sVar9 = allowed_actions_cnt;
    if (allowed_actions == (action *)0x0) {
      sVar9 = priv->A;
    }
    fVar12 = 3.4028235e+38;
    for (sVar5 = 0; sVar9 != sVar5; sVar5 = sVar5 + 1) {
      fVar11 = allowed_actions_cost[sVar5];
      if (fVar12 <= allowed_actions_cost[sVar5]) {
        fVar11 = fVar12;
      }
      fVar12 = fVar11;
    }
    if (fVar12 < 3.4028235e+38) {
      uVar4 = 0xffffffff;
      uVar6 = 0;
      local_40 = ec_cnt;
      for (sVar5 = 0; sVar9 != sVar5; sVar5 = sVar5 + 1) {
        if ((allowed_actions_cost[sVar5] <= fVar12) &&
           ((uVar1 = uVar6 + 1, uVar6 == 0 ||
            (fVar11 = merand48(&priv->all->random_state), uVar6 = uVar1, fVar11 < 1.0 / (float)uVar1
            )))) {
          if (allowed_actions == (action *)0x0) {
            uVar4 = (int)sVar5 + 1;
            uVar6 = uVar1;
          }
          else {
            uVar4 = allowed_actions[sVar5];
            uVar6 = uVar1;
          }
        }
      }
      if (uVar4 != 0xffffffff) goto LAB_0011c24e;
    }
  }
  if ((priv->perturb_oracle <= 0.0) || (priv->state != INIT_TRAIN)) {
    if (oracle_actions_cnt != 0) goto LAB_0011c203;
  }
  else {
    fVar12 = merand48(&priv->all->random_state);
    if ((oracle_actions_cnt != 0) && (priv->perturb_oracle <= fVar12)) {
LAB_0011c203:
      lVar7 = random();
      uVar4 = oracle_actions[lVar7];
      goto LAB_0011c24e;
    }
  }
  if (allowed_actions_cnt == 0) {
    if (priv->is_ldf == true) {
      lVar7 = random();
      uVar4 = (uint)lVar7;
    }
    else {
      lVar7 = random();
      uVar4 = (int)lVar7 + 1;
    }
  }
  else {
    lVar7 = random();
    uVar4 = allowed_actions[lVar7];
  }
  oracle_actions_cnt = 0;
LAB_0011c24e:
  bVar3 = need_memo_foreach_action(priv);
  if ((bVar3) && (priv->state == INIT_TRAIN)) {
    this = (v_array<Search::action_cache> *)operator_new(0x20);
    this->_begin = (action_cache *)0x0;
    this->_end = (action_cache *)0x0;
    this->end_array = (action_cache *)0x0;
    this->erase_count = 0;
    this_cache = this;
    ppVar8 = allowed_actions_to_ld(priv,1,allowed_actions,allowed_actions_cnt,allowed_actions_cost);
    pwVar2 = (ppVar8->cs).costs._begin;
    lVar7 = (long)(ppVar8->cs).costs._end - (long)pwVar2 >> 4;
    puVar10 = &pwVar2->class_index;
    while (bVar3 = lVar7 != 0, lVar7 = lVar7 + -1, bVar3) {
      target = *puVar10;
      bVar3 = array_contains<unsigned_int>(target,oracle_actions,oracle_actions_cnt);
      local_50.cost = 0.0;
      if (!bVar3) {
        local_50.cost = 1.0;
      }
      local_50.min_cost = 0.0;
      local_50.is_opt = target == uVar4;
      local_50.k = target;
      v_array<Search::action_cache>::push_back(this,&local_50);
      puVar10 = puVar10 + 4;
    }
    v_array<v_array<Search::action_cache>_*>::push_back(&priv->memo_foreach_action,&this_cache);
  }
  return uVar4;
}

Assistant:

action choose_oracle_action(search_private& priv, size_t ec_cnt, const action* oracle_actions,
    size_t oracle_actions_cnt, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost)
{
  action a = (action)-1;
  if (priv.use_action_costs)
  {
    size_t K = (allowed_actions == nullptr) ? priv.A : allowed_actions_cnt;
    cdbg << "costs = [";
    for (size_t k = 0; k < K; k++) cdbg << ' ' << allowed_actions_cost[k];
    cdbg << " ]" << endl;
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++) min_cost = min(min_cost, allowed_actions_cost[k]);
    cdbg << "min_cost = " << min_cost;
    if (min_cost < FLT_MAX)
    {
      size_t count = 0;
      for (size_t k = 0; k < K; k++)
        if (allowed_actions_cost[k] <= min_cost)
        {
          cdbg << ", hit @ " << k;
          count++;
          if ((count == 1) || (merand48(priv.all->random_state) < 1. / (float)count))
          {
            a = (allowed_actions == nullptr) ? (uint32_t)(k + 1) : allowed_actions[k];
            cdbg << "***";
          }
        }
    }
    cdbg << endl;
  }

  if (a == (action)-1)
  {
    if ((priv.perturb_oracle > 0.) && (priv.state == INIT_TRAIN) &&
        (merand48(priv.all->random_state) < priv.perturb_oracle))
      oracle_actions_cnt = 0;
    a = (oracle_actions_cnt > 0)
        ? oracle_actions[random(priv.all->random_state, oracle_actions_cnt)]
        : (allowed_actions_cnt > 0) ? allowed_actions[random(priv.all->random_state, allowed_actions_cnt)]
                                    : priv.is_ldf ? (action)random(priv.all->random_state, ec_cnt)
                                                  : (action)(1 + random(priv.all->random_state, priv.A));
  }
  cdbg << "choose_oracle_action from oracle_actions = [";
  for (size_t i = 0; i < oracle_actions_cnt; i++) cdbg << " " << oracle_actions[i];
  cdbg << " ], ret=" << a << endl;
  if (need_memo_foreach_action(priv) && (priv.state == INIT_TRAIN))
  {
    v_array<action_cache>* this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
    // TODO we don't really need to construct this polylabel
    polylabel l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    size_t K = cs_get_costs_size(priv.cb_learner, l);
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, l, k);
      float cost = array_contains(cl, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f;
      this_cache->push_back(action_cache(0., cl, cl == a, cost));
    }
    assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
    priv.memo_foreach_action.push_back(this_cache);
    cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << " from oracle" << endl;
  }
  return a;
}